

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O2

int json_pointer_object_get_recursive(json_object *obj,char *path,json_object **value)

{
  int iVar1;
  json_pointer_get_result res;
  json_pointer_get_result jStack_28;
  
  iVar1 = json_pointer_result_get_recursive(obj,path,&jStack_28);
  if (value != (json_object **)0x0 && iVar1 == 0) {
    *value = jStack_28.obj;
  }
  return iVar1;
}

Assistant:

static int json_pointer_object_get_recursive(struct json_object *obj, char *path,
                                             struct json_object **value)
{
	struct json_pointer_get_result res;
	int rc;

	rc = json_pointer_result_get_recursive(obj, path, &res);
	if (rc)
		return rc;

	if (value)
		*value = res.obj;

	return 0;
}